

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O1

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedType<int>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedType<int> min,WrappedType<int> max,float gridSize)

{
  int iVar1;
  uint uVar2;
  deUint32 dVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  WrappedType<int> WVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  float fVar21;
  deRandom rnd;
  uint local_9c;
  ulong local_98;
  deRandom local_80;
  char *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  char *local_40;
  ulong local_38;
  
  local_68 = (ulong)(uint)(componentCount * 4);
  if (stride != 0) {
    local_68 = (ulong)(uint)stride;
  }
  local_38 = (ulong)(uint)((int)local_68 * 2);
  iVar6 = (int)local_68 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar6 = 0;
  }
  local_70 = (char *)operator_new__((long)(iVar6 * count + offset));
  deRandom_init(&local_80,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar21 = (float)max.m_value - (float)min.m_value;
    uVar20 = -(uint)(-fVar21 <= fVar21);
    uVar2 = (uint)((float)(~uVar20 & (uint)-fVar21 | (uint)fVar21 & uVar20) * gridSize);
    uVar20 = 0x4000000;
    if (0x4000000 < (int)uVar2) {
      uVar20 = uVar2;
    }
    if (0 < count) {
      local_40 = local_70 + offset;
      uVar2 = max.m_value - min.m_value;
      iVar10 = (int)local_68;
      local_48 = (ulong)(uint)(iVar10 * 3);
      local_50 = (ulong)(uint)(iVar10 * 4);
      local_58 = (ulong)(uint)(iVar10 * 5);
      local_60 = (ulong)(uint)count;
      iVar10 = 8;
      iVar11 = 0xc;
      local_98 = 0;
      do {
        local_9c = 0;
        while( true ) {
          WVar8.m_value = min.m_value;
          if (min.m_value < max.m_value) {
            dVar3 = deRandom_getUint32(&local_80);
            WVar8.m_value = dVar3 % uVar2 + min.m_value;
          }
          iVar9 = WVar8.m_value - WVar8.m_value % (int)uVar20;
          uVar15 = max.m_value - iVar9 & 0x7fffffff;
          uVar16 = uVar15 - uVar20;
          uVar12 = uVar20;
          if (uVar20 <= uVar15 && uVar16 != 0) {
            dVar3 = deRandom_getUint32(&local_80);
            uVar12 = dVar3 % uVar16 + uVar20;
          }
          WVar8.m_value = min.m_value;
          if (min.m_value < max.m_value) {
            dVar3 = deRandom_getUint32(&local_80);
            WVar8.m_value = dVar3 % uVar2 + min.m_value;
          }
          iVar14 = WVar8.m_value - WVar8.m_value % (int)uVar20;
          uVar16 = max.m_value - iVar14 & 0x7fffffff;
          uVar18 = uVar16 - uVar20;
          uVar15 = uVar20;
          if (uVar20 <= uVar16 && uVar18 != 0) {
            dVar3 = deRandom_getUint32(&local_80);
            uVar15 = dVar3 % uVar18 + uVar20;
          }
          iVar19 = 0;
          if (2 < componentCount) {
            WVar8.m_value = min.m_value;
            if (min.m_value < max.m_value) {
              dVar3 = deRandom_getUint32(&local_80);
              WVar8.m_value = dVar3 % uVar2 + min.m_value;
            }
            iVar19 = WVar8.m_value - WVar8.m_value % (int)uVar20;
          }
          iVar7 = 1;
          if (3 < componentCount) {
            WVar8.m_value = min.m_value;
            if (min.m_value < max.m_value) {
              dVar3 = deRandom_getUint32(&local_80);
              WVar8.m_value = dVar3 % uVar2 + min.m_value;
            }
            iVar7 = WVar8.m_value - WVar8.m_value % (int)uVar20;
          }
          iVar13 = uVar12 - (int)uVar12 % (int)uVar20;
          iVar17 = uVar15 - (int)uVar15 % (int)uVar20;
          if ((componentCount < 3) ||
             (((fVar21 = (float)iVar19 + (float)iVar13, uVar12 = -(uint)(-fVar21 <= fVar21),
               (float)(int)uVar20 <= (float)(~uVar12 & (uint)-fVar21 | (uint)fVar21 & uVar12) &&
               (fVar21 = (float)iVar7 + (float)iVar17, uVar12 = -(uint)(-fVar21 <= fVar21),
               (float)(int)uVar20 <= (float)(~uVar12 & (uint)-fVar21 | (uint)fVar21 & uVar12))) ||
              (2 < local_9c)))) break;
          local_9c = local_9c + 1;
        }
        iVar4 = iVar6 * (int)local_98;
        *(int *)(local_40 + iVar4) = iVar9;
        *(int *)(local_40 + (iVar4 + 4)) = iVar14;
        iVar1 = (int)local_68;
        iVar13 = iVar13 + iVar9;
        *(int *)(local_40 + (iVar4 + iVar1)) = iVar13;
        *(int *)(local_40 + (iVar4 + iVar1 + 4)) = iVar14;
        iVar17 = iVar17 + iVar14;
        *(int *)(local_40 + (iVar4 + (int)local_38)) = iVar9;
        *(int *)(local_40 + (iVar4 + (int)local_38 + 4)) = iVar17;
        *(int *)(local_40 + (iVar4 + (int)local_48)) = iVar9;
        *(int *)(local_40 + (iVar4 + 4 + (int)local_48)) = iVar17;
        *(int *)(local_40 + (iVar4 + (int)local_50)) = iVar13;
        *(int *)(local_40 + (iVar4 + 4 + (int)local_50)) = iVar14;
        *(int *)(local_40 + (iVar4 + (int)local_58)) = iVar13;
        *(int *)(local_40 + (iVar4 + 4 + (int)local_58)) = iVar17;
        if (2 < componentCount) {
          lVar5 = 6;
          iVar9 = iVar10;
          do {
            *(int *)(local_40 + iVar9) = iVar19;
            iVar9 = iVar9 + iVar1;
            lVar5 = lVar5 + -1;
          } while (lVar5 != 0);
        }
        if (3 < componentCount) {
          lVar5 = 6;
          iVar9 = iVar11;
          do {
            *(int *)(local_40 + iVar9) = iVar7;
            iVar9 = iVar9 + iVar1;
            lVar5 = lVar5 + -1;
          } while (lVar5 != 0);
        }
        local_98 = local_98 + 1;
        iVar10 = iVar10 + iVar6;
        iVar11 = iVar11 + iVar6;
      } while (local_98 != local_60);
    }
  }
  return local_70;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}